

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoflann.hpp
# Opt level: O0

void __thiscall
nanoflann::
KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
::planeSplit(KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
             *this,KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                   *obj,unsigned_long *ind,unsigned_long count,int cutfeat,DistanceType *cutval,
            unsigned_long *lim1,unsigned_long *lim2)

{
  KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
  *pKVar1;
  long in_RCX;
  long in_RDX;
  KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
  *in_RDI;
  double *in_R9;
  ElementType EVar2;
  undefined8 *in_stack_00000008;
  undefined8 *in_stack_00000010;
  unsigned_long right;
  unsigned_long left;
  int in_stack_ffffffffffffffac;
  uint in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb4;
  undefined1 in_stack_ffffffffffffffb5;
  undefined1 uVar3;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 uVar4;
  bool bVar5;
  undefined1 uVar6;
  KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
  *local_38;
  
  local_38 = (KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
              *)0x0;
  pKVar1 = (KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
            *)(in_RCX + -1);
  while( true ) {
    while( true ) {
      bVar5 = false;
      if (local_38 <= pKVar1) {
        EVar2 = dataset_get(pKVar1,in_RDI,
                            (ulong)CONCAT16(in_stack_ffffffffffffffb6,
                                            CONCAT15(in_stack_ffffffffffffffb5,
                                                     CONCAT14(in_stack_ffffffffffffffb4,
                                                              in_stack_ffffffffffffffb0))),
                            in_stack_ffffffffffffffac);
        bVar5 = EVar2 < *in_R9;
      }
      if (!bVar5) break;
      local_38 = (KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                  *)((long)&(local_38->vind).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start + 1);
    }
    uVar6 = 0;
    while( true ) {
      in_stack_ffffffffffffffb6 = false;
      if ((pKVar1 != (KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                      *)0x0) && (in_stack_ffffffffffffffb6 = false, local_38 <= pKVar1)) {
        EVar2 = dataset_get(pKVar1,in_RDI,
                            CONCAT17(uVar6,(uint7)CONCAT15(in_stack_ffffffffffffffb5,
                                                           CONCAT14(in_stack_ffffffffffffffb4,
                                                                    in_stack_ffffffffffffffb0))),
                            in_stack_ffffffffffffffac);
        in_stack_ffffffffffffffb6 = *in_R9 <= EVar2;
      }
      if ((bool)in_stack_ffffffffffffffb6 == false) break;
      pKVar1 = (KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                *)((long)&pKVar1[-1].pool.wastedMemory + 7);
    }
    if ((pKVar1 < local_38) ||
       (pKVar1 == (KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                   *)0x0)) break;
    std::swap<unsigned_long>
              ((unsigned_long *)(in_RDX + (long)local_38 * 8),
               (unsigned_long *)(in_RDX + (long)pKVar1 * 8));
    local_38 = (KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                *)((long)&(local_38->vind).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start + 1);
    pKVar1 = (KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
              *)((long)&pKVar1[-1].pool.wastedMemory + 7);
  }
  *in_stack_00000008 = local_38;
  pKVar1 = (KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
            *)(in_RCX + -1);
  uVar4 = 0;
  while( true ) {
    while( true ) {
      bVar5 = false;
      if (local_38 <= pKVar1) {
        EVar2 = dataset_get(pKVar1,in_RDI,
                            CONCAT17(uVar6,CONCAT16(uVar4,(uint6)CONCAT14(in_stack_ffffffffffffffb4,
                                                                          in_stack_ffffffffffffffb0)
                                                   )),in_stack_ffffffffffffffac);
        bVar5 = EVar2 <= *in_R9;
      }
      if (!bVar5) break;
      local_38 = (KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                  *)((long)&(local_38->vind).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start + 1);
    }
    uVar3 = 0;
    while( true ) {
      in_stack_ffffffffffffffb4 = false;
      if ((pKVar1 != (KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                      *)0x0) && (in_stack_ffffffffffffffb4 = false, local_38 <= pKVar1)) {
        EVar2 = dataset_get(pKVar1,in_RDI,
                            CONCAT17(uVar6,CONCAT16(uVar4,CONCAT15(uVar3,(uint5)
                                                  in_stack_ffffffffffffffb0))),
                            in_stack_ffffffffffffffac);
        in_stack_ffffffffffffffb4 = *in_R9 < EVar2;
      }
      if ((bool)in_stack_ffffffffffffffb4 == false) break;
      pKVar1 = (KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                *)((long)&pKVar1[-1].pool.wastedMemory + 7);
    }
    if ((pKVar1 < local_38) ||
       (pKVar1 == (KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                   *)0x0)) break;
    std::swap<unsigned_long>
              ((unsigned_long *)(in_RDX + (long)local_38 * 8),
               (unsigned_long *)(in_RDX + (long)pKVar1 * 8));
    local_38 = (KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                *)((long)&(local_38->vind).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start + 1);
    pKVar1 = (KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
              *)((long)&pKVar1[-1].pool.wastedMemory + 7);
  }
  *in_stack_00000010 = local_38;
  return;
}

Assistant:

void planeSplit(Derived &obj, IndexType *ind, const IndexType count,
                  int cutfeat, DistanceType &cutval, IndexType &lim1,
                  IndexType &lim2) {
    /* Move vector indices for left subtree to front of list. */
    IndexType left = 0;
    IndexType right = count - 1;
    for (;;) {
      while (left <= right && dataset_get(obj, ind[left], cutfeat) < cutval)
        ++left;
      while (right && left <= right &&
             dataset_get(obj, ind[right], cutfeat) >= cutval)
        --right;
      if (left > right || !right)
        break; // "!right" was added to support unsigned Index types
      std::swap(ind[left], ind[right]);
      ++left;
      --right;
    }
    /* If either list is empty, it means that all remaining features
     * are identical. Split in the middle to maintain a balanced tree.
     */
    lim1 = left;
    right = count - 1;
    for (;;) {
      while (left <= right && dataset_get(obj, ind[left], cutfeat) <= cutval)
        ++left;
      while (right && left <= right &&
             dataset_get(obj, ind[right], cutfeat) > cutval)
        --right;
      if (left > right || !right)
        break; // "!right" was added to support unsigned Index types
      std::swap(ind[left], ind[right]);
      ++left;
      --right;
    }
    lim2 = left;
  }